

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  long in_RSI;
  scoped_padder *in_RDI;
  scoped_padder p;
  size_t text_size;
  scoped_padder p_1;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  memory_buf_t *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  scoped_padder *in_stack_ffffffffffffff80;
  memory_buf_t *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
               (padding_info *)in_stack_ffffffffffffff70,
               (memory_buf_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    scoped_padder::~scoped_padder(in_RDI);
  }
  else {
    bVar1 = padding_info::enabled((padding_info *)&in_RDI->dest_);
    if (bVar1) {
      in_stack_ffffffffffffff58 = (char *)CLI::std::char_traits<char>::length((char_type *)0x5ff2ce)
      ;
      scoped_padder::count_digits<int>(0);
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
               (padding_info *)in_stack_ffffffffffffff70,
               (memory_buf_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    ::fmt::v11::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(char *)in_RDI);
    view.size_ = (size_t)in_stack_ffffffffffffff80;
    view.data_ = in_stack_ffffffffffffff78;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffff70);
    ::fmt::v11::detail::buffer<char>::push_back((buffer<char> *)in_RDI,in_stack_ffffffffffffff58);
    fmt_helper::append_int<int>(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    scoped_padder::~scoped_padder(in_RDI);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        size_t text_size;
        if (padinfo_.enabled()) {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) +
                        ScopedPadder::count_digits(msg.source.line) + 1;
        } else {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }